

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Instruction * __thiscall
spv::Builder::addEntryPoint(Builder *this,ExecutionModel model,Function *function,char *name)

{
  Id id;
  Instruction *pIVar1;
  value_type local_38;
  Instruction *local_30;
  Instruction *entryPoint;
  char *name_local;
  Function *function_local;
  Builder *pBStack_10;
  ExecutionModel model_local;
  Builder *this_local;
  
  entryPoint = (Instruction *)name;
  name_local = (char *)function;
  function_local._4_4_ = model;
  pBStack_10 = this;
  pIVar1 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar1,OpEntryPoint);
  local_30 = pIVar1;
  spv::Instruction::reserveOperands(pIVar1,3);
  spv::Instruction::addImmediateOperand(local_30,function_local._4_4_);
  pIVar1 = local_30;
  id = spv::Function::getId((Function *)name_local);
  spv::Instruction::addIdOperand(pIVar1,id);
  spv::Instruction::addStringOperand(local_30,(char *)entryPoint);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->entryPoints,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  return local_30;
}

Assistant:

Instruction* Builder::addEntryPoint(ExecutionModel model, Function* function, const char* name)
{
    Instruction* entryPoint = new Instruction(OpEntryPoint);
    entryPoint->reserveOperands(3);
    entryPoint->addImmediateOperand(model);
    entryPoint->addIdOperand(function->getId());
    entryPoint->addStringOperand(name);

    entryPoints.push_back(std::unique_ptr<Instruction>(entryPoint));

    return entryPoint;
}